

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpgen.cpp
# Opt level: O3

void __thiscall
cp::cpgen::getWalkingPattern
          (cpgen *this,Vector3 *com_pos,Quat *waist_r,Pose *right_leg_pose,Pose *left_leg_pose)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ActualDstType actualDst_1;
  ActualDstType actualDst;
  Vector3 local_48;
  
  if (getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
      ::step_delta_time == '\0') {
    getWalkingPattern(this);
  }
  if (getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
      ::end_cp == '\0') {
    getWalkingPattern(this);
  }
  if (getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
      ::ref_waist_pose == '\0') {
    getWalkingPattern(this);
  }
  if (getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
      ::ref_land_pose == '\0') {
    getWalkingPattern(this);
  }
  if (*(int *)(this + 0x8dc) != 0) {
    if (*(double *)(this + 0x860) + *(double *)(this + 0x858) <= getWalkingPattern::step_delta_time)
    {
      calcNextFootprint(this,(Vector3 *)(this + 0x8c0),*(double *)(this + 0x8d0),
                        &getWalkingPattern::ref_waist_pose,getWalkingPattern::ref_land_pose);
      calcEndCP((cpgen *)&local_48,(Pose *)this);
      getWalkingPattern::end_cp.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
      m_storage.m_data.array[1] =
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      getWalkingPattern::end_cp.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
      m_storage.m_data.array[0] =
           local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0];
      CoMTrack::calcRefZMP((CoMTrack *)this,&getWalkingPattern::end_cp);
      LegTrack::setStepVar
                ((LegTrack *)(this + 0x80),getWalkingPattern::ref_land_pose,
                 &getWalkingPattern::ref_waist_pose.qq,*(rl *)(this + 0x8d8),
                 *(walking_state *)(this + 0x8dc));
      getWalkingPattern::step_delta_time = 0.0;
    }
    if (getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
        ::leg_pose == '\0') {
      getWalkingPattern();
    }
    CoMTrack::getCoMTrack
              (&local_48,(CoMTrack *)this,&getWalkingPattern::end_cp,
               getWalkingPattern::step_delta_time);
    (com_pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
    [2] = local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2];
    (com_pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
    [0] = local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0];
    (com_pos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
    [1] = local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
    LegTrack::getLegTrack
              ((LegTrack *)(this + 0x80),getWalkingPattern::step_delta_time,
               getWalkingPattern::leg_pose);
    dVar1 = *(double *)(this + 0x280);
    dVar2 = *(double *)(this + 0x288);
    dVar3 = *(double *)(this + 0x298);
    (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[2] = *(double *)(this + 0x290);
    (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[3] = dVar3;
    (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[0] = dVar1;
    (waist_r->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
    m_data.array[1] = dVar2;
    dVar1 = getWalkingPattern::leg_pose[0].pp.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    (right_leg_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] =
         getWalkingPattern::leg_pose[0].pp.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    (right_leg_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = dVar1;
    (right_leg_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] =
         getWalkingPattern::leg_pose[0].pp.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    dVar1 = getWalkingPattern::leg_pose[0].qq.m_coeffs.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
    (right_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[0] =
         getWalkingPattern::leg_pose[0].qq.m_coeffs.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
    (right_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[1] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[0].qq.m_coeffs.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
    (right_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[2] =
         getWalkingPattern::leg_pose[0].qq.m_coeffs.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
    (right_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[3] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[0].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0] =
         getWalkingPattern::leg_pose[0].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[1] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[0].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[2] =
         getWalkingPattern::leg_pose[0].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[3] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[0].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[4] =
         getWalkingPattern::leg_pose[0].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[5] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[0].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[6] =
         getWalkingPattern::leg_pose[0].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[7] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[0].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[8] =
         getWalkingPattern::leg_pose[0].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[9] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[0].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
    ;
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[10] =
         getWalkingPattern::leg_pose[0].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xb] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[0].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
    ;
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xc] =
         getWalkingPattern::leg_pose[0].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xd] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[0].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
    ;
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xe] =
         getWalkingPattern::leg_pose[0].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe];
    (right_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xf] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[0].r.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    (right_leg_pose->r).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] =
         getWalkingPattern::leg_pose[0].r.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    (right_leg_pose->r).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = dVar1;
    (right_leg_pose->r).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] =
         getWalkingPattern::leg_pose[0].r.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    dVar1 = getWalkingPattern::leg_pose[1].pp.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    (left_leg_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] =
         getWalkingPattern::leg_pose[1].pp.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    (left_leg_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] = dVar1;
    (left_leg_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] =
         getWalkingPattern::leg_pose[1].pp.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    dVar1 = getWalkingPattern::leg_pose[1].qq.m_coeffs.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
    (left_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[0] =
         getWalkingPattern::leg_pose[1].qq.m_coeffs.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
    (left_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[1] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[1].qq.m_coeffs.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
    (left_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[2] =
         getWalkingPattern::leg_pose[1].qq.m_coeffs.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
    (left_leg_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
    m_storage.m_data.array[3] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[1].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0] =
         getWalkingPattern::leg_pose[1].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[1] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[1].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[2] =
         getWalkingPattern::leg_pose[1].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[3] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[1].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[4] =
         getWalkingPattern::leg_pose[1].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[5] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[1].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[6] =
         getWalkingPattern::leg_pose[1].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[7] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[1].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[8] =
         getWalkingPattern::leg_pose[1].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[9] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[1].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb]
    ;
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[10] =
         getWalkingPattern::leg_pose[1].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xb] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[1].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd]
    ;
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xc] =
         getWalkingPattern::leg_pose[1].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xd] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[1].af.m_matrix.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf]
    ;
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xe] =
         getWalkingPattern::leg_pose[1].af.m_matrix.
         super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe];
    (left_leg_pose->af).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xf] = dVar1;
    dVar1 = getWalkingPattern::leg_pose[1].r.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    (left_leg_pose->r).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
    .array[0] = getWalkingPattern::leg_pose[1].r.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                [0];
    (left_leg_pose->r).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
    .array[1] = dVar1;
    (left_leg_pose->r).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
    .array[2] = getWalkingPattern::leg_pose[1].r.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                [2];
    getWalkingPattern::step_delta_time =
         *(double *)(this + 0x850) + getWalkingPattern::step_delta_time;
    if (*(double *)(this + 0x860) + *(double *)(this + 0x858) <= getWalkingPattern::step_delta_time)
    {
      *(uint *)(this + 0x8d8) = (uint)(*(int *)(this + 0x8d8) == 0);
      switch(*(undefined4 *)(this + 0x8dc)) {
      case 3:
        *(undefined4 *)(this + 0x8dc) = 4;
        break;
      case 4:
        *(undefined4 *)(this + 0x8dc) = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[cpgen] Stopped",0xf);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        break;
      case 5:
        *(undefined4 *)(this + 0x8dc) = 3;
        break;
      case 6:
        *(undefined4 *)(this + 0x8dc) = 7;
        break;
      case 7:
      case 9:
        *(undefined4 *)(this + 0x8dc) = 1;
        break;
      case 8:
        *(undefined4 *)(this + 0x8dc) = 2;
      }
    }
  }
  return;
}

Assistant:

void cpgen::getWalkingPattern(Vector3* com_pos, Quat* waist_r,
                              Pose* right_leg_pose, Pose* left_leg_pose) {

  static double step_delta_time = double_sup_time + single_sup_time + 1.0;
  static Vector2 end_cp(init_waist_pose.p().x(), init_waist_pose.p().y());
  static Pose ref_waist_pose = init_waist_pose;
  static Pose ref_land_pose[2] = {init_feet_pose[0], init_feet_pose[1]};

  if (wstate == stopped) return;

  // if finished a step, calc leg track and reference ZMP.
  if (step_delta_time >= double_sup_time + single_sup_time) {
    // to calc legtrack
    calcNextFootprint(land_pos, land_pos.z(),
                      ref_waist_pose, ref_land_pose);
    end_cp = calcEndCP(ref_land_pose);
    comtrack.calcRefZMP(end_cp);
    legtrack.setStepVar(ref_land_pose, ref_waist_pose.q(), swingleg, wstate);
    step_delta_time = 0.0;
  }

  // push walking pattern
  static Pose leg_pose[2];
  *com_pos = comtrack.getCoMTrack(end_cp, step_delta_time);
  legtrack.getLegTrack(step_delta_time, leg_pose);
  *waist_r = legtrack.getWaistTrack(step_delta_time);
  *right_leg_pose = leg_pose[0];
  *left_leg_pose  = leg_pose[1];

  // setting flag and time if finished a step
  step_delta_time += dt;
  if (step_delta_time >= double_sup_time + single_sup_time) {
    swingleg = swingleg == right ? left : right;
    if (wstate == starting1) {
      wstate = starting2;
    } else if (wstate == starting2) {
      // if (whichwalk == step) {
      //   wstate = step;
      // } else {
      //   wstate = walk;
      // }
      wstate = walk;
    } else if (wstate == stop_next) {
      wstate = stopping1;
    } else if (wstate == stopping1) {
      wstate = stopping2;
    } else if (wstate == stopping2) {
      wstate = stopped;
      std::cout << "[cpgen] Stopped" << std::endl;
    } else if (wstate == walk2step) {
      wstate = step;
    } else if (wstate == step2walk) {
      wstate = walk;
    }
  }
}